

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O3

string * __thiscall
enact::AstSerialise::visitBlockExpr_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,BlockExpr *expr)

{
  pointer puVar1;
  Stmt *pSVar2;
  Expr *pEVar3;
  string *psVar4;
  ostream *poVar5;
  pointer puVar6;
  stringstream s;
  char local_1f1;
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  string *local_1d0;
  BlockExpr *local_1c8;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(this->m_ident)._M_dataplus._M_p,(this->m_ident)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(Expr::Block (\n",0xf);
  local_1d0 = &this->m_ident;
  std::__cxx11::string::append((char *)local_1d0);
  puVar6 = (expr->stmts).
           super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (expr->stmts).
           super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1c8 = expr;
  local_1c0 = __return_storage_ptr__;
  if (puVar6 != puVar1) {
    do {
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(this->m_ident)._M_dataplus._M_p,
                          (this->m_ident)._M_string_length);
      pSVar2 = (puVar6->_M_t).super___uniq_ptr_impl<enact::Stmt,_std::default_delete<enact::Stmt>_>.
               _M_t.super__Tuple_impl<0UL,_enact::Stmt_*,_std::default_delete<enact::Stmt>_>.
               super__Head_base<0UL,_enact::Stmt_*,_false>._M_head_impl;
      (*pSVar2->_vptr_Stmt[2])(&local_1f0,pSVar2,this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)local_1f0,local_1e8);
      local_1f1 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_1f1,1);
      if (local_1f0 != local_1e0) {
        operator_delete(local_1f0,local_1e0[0] + 1);
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar1);
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(this->m_ident)._M_dataplus._M_p,(this->m_ident)._M_string_length);
  psVar4 = local_1c0;
  pEVar3 = (local_1c8->expr)._M_t.
           super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
           super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
           super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  (*pEVar3->_vptr_Expr[2])(&local_1f0,pEVar3,&this->field_0x8);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_1f0,local_1e8);
  local_1f1 = ')';
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_1f1,1);
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  std::__cxx11::string::erase((ulong)local_1d0,0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

std::string AstSerialise::visitBlockExpr(BlockExpr &expr) {
        std::stringstream s;

        s << m_ident << "(Expr::Block (\n";
        m_ident += "    ";

        for (auto &statement : expr.stmts) {
            s << m_ident << visitStmt(*statement) << '\n';
        }
        s << m_ident << visitExpr(*expr.expr) << ')';

        m_ident.erase(0, 4);

        return s.str();
    }